

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

char * os_get_fext(char *filepath)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  
  sVar2 = strlen(filepath);
  uVar3 = (sVar2 & 0xffffffff) + 1;
  do {
    uVar4 = (int)uVar3 - 2;
    if ((int)uVar4 < 0) {
      return (char *)0x0;
    }
    cVar1 = filepath[uVar4 & 0x7fffffff];
    if (cVar1 == '\\') {
      return (char *)0x0;
    }
    if (cVar1 == '/') {
      return (char *)0x0;
    }
    uVar3 = uVar3 - 1;
  } while (cVar1 != '.');
  return filepath + (uVar3 & 0xffffffff);
}

Assistant:

const char *os_get_fext(const char *filepath) {

    for (int32_t i = strlen(filepath) - 1; i >= 0; i--) {
        if (filepath[i] == '/' || filepath[i] == '\\') {
            return NULL;
        } else if (filepath[i] == '.') {
            const char *extstr = &filepath[i + 1];
            return extstr;
        }
    }
    return NULL;
}